

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O0

void test_from_neg<wchar_t>
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *source,
               string *target,string *encoding)

{
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  undefined8 uVar4;
  wchar_t *pwVar5;
  long lVar6;
  long lVar7;
  ostream *poVar8;
  ostream *this;
  runtime_error *this_00;
  int iVar9;
  method_type in_EDX;
  conversion_error *anon_var_0_5;
  conversion_error *anon_var_0_4;
  conversion_error *anon_var_0_3;
  conversion_error *anon_var_0_2;
  conversion_error *anon_var_0_1;
  conversion_error *anon_var_0;
  locale l;
  generator g;
  string *in_stack_fffffffffffff9b0;
  string *in_stack_fffffffffffff9b8;
  string *s;
  runtime_error *in_stack_fffffffffffff9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c8;
  string *in_stack_fffffffffffff9d0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffff9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  allocator *paVar10;
  char *in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa00;
  method_type mVar11;
  locale *in_stack_fffffffffffffa08;
  wchar_t *in_stack_fffffffffffffa10;
  wchar_t *in_stack_fffffffffffffa18;
  undefined1 local_3e1 [41];
  string local_3b8 [38];
  undefined1 local_392;
  allocator local_391;
  string local_390 [40];
  string local_368 [38];
  undefined1 local_342;
  allocator local_341;
  string local_340 [40];
  string local_318 [38];
  undefined1 local_2f2;
  allocator local_2f1;
  string local_2f0 [40];
  string local_2c8 [38];
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0 [40];
  string local_278 [38];
  undefined1 local_252;
  allocator local_251;
  string local_250 [40];
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string local_200 [32];
  string local_1e0 [38];
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [32];
  string local_198 [38];
  undefined1 local_172;
  allocator local_171;
  string local_170 [32];
  string local_150 [38];
  undefined1 local_12a;
  allocator local_129;
  string local_128 [32];
  string local_108 [38];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [38];
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  string local_78 [48];
  string local_48 [32];
  locale local_28 [8];
  generator local_20 [32];
  
  mVar11 = (method_type)((ulong)in_stack_fffffffffffffa00 >> 0x20);
  booster::locale::generator::generator(local_20);
  std::operator+(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  booster::locale::generator::operator()
            ((generator *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  std::__cxx11::string::~string(local_48);
  test_counter = test_counter + 1;
  booster::locale::conv::from_utf<wchar_t>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (method_type)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
  _Var2 = std::operator==(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string(local_78);
  if (!_Var2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xe5);
    poVar3 = std::operator<<(poVar3," from_utf<Char>(source,encoding)==target");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    iVar9 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar9;
    if (bVar1) {
      local_9a = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"Error limits reached, stopping unit test",&local_99);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      local_9a = 0;
      __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::wstring::c_str();
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)in_stack_fffffffffffff9c8,(string *)in_stack_fffffffffffff9c0,
             (method_type)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
  _Var2 = std::operator==(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string(local_c0);
  if (!_Var2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xe6);
    poVar3 = std::operator<<(poVar3," from_utf<Char>(source.c_str(),encoding)==target");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    iVar9 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar9;
    if (bVar1) {
      local_e2 = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"Error limits reached, stopping unit test",&local_e1);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      local_e2 = 0;
      __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar5 = (wchar_t *)std::__cxx11::wstring::c_str();
  lVar6 = std::__cxx11::wstring::c_str();
  lVar7 = std::__cxx11::wstring::size();
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)local_108,pwVar5,(string *)(lVar6 + lVar7 * 4),in_EDX);
  _Var2 = std::operator==(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string(local_108);
  if (!_Var2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xe7);
    poVar3 = std::operator<<(poVar3,
                             " from_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    iVar9 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar9;
    if (bVar1) {
      local_12a = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"Error limits reached, stopping unit test",&local_129);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      local_12a = 0;
      __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::from_utf<wchar_t>
            (in_stack_fffffffffffff9d8,(locale *)in_stack_fffffffffffff9d0,
             (method_type)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
  _Var2 = std::operator==(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string(local_150);
  if (!_Var2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xe8);
    poVar3 = std::operator<<(poVar3," from_utf<Char>(source,l)==target");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    iVar9 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar9;
    if (bVar1) {
      local_172 = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"Error limits reached, stopping unit test",&local_171);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      local_172 = 0;
      __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::wstring::c_str();
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)in_stack_fffffffffffff9c8,(locale *)in_stack_fffffffffffff9c0,
             (method_type)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
  _Var2 = std::operator==(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string(local_198);
  if (!_Var2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xe9);
    poVar3 = std::operator<<(poVar3," from_utf<Char>(source.c_str(),l)==target");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    iVar9 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar9;
    if (bVar1) {
      local_1ba = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"Error limits reached, stopping unit test",&local_1b9);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      local_1ba = 0;
      __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::size();
  booster::locale::conv::from_utf<wchar_t>
            (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,mVar11);
  _Var2 = std::operator==(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  std::__cxx11::string::~string(local_1e0);
  if (!_Var2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xea);
    poVar3 = std::operator<<(poVar3,
                             " from_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    iVar9 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar9;
    if (bVar1) {
      local_202 = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,"Error limits reached, stopping unit test",&local_201);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      local_202 = 0;
      __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::from_utf<wchar_t>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (method_type)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
  std::__cxx11::string::~string(local_228);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xec);
  poVar3 = std::operator<<(poVar3," from_utf<Char>(source,encoding,stop)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if (0x14 < error_counter) {
    local_252 = 1;
    error_counter = error_counter + 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"Error limits reached, stopping unit test",&local_251);
    booster::runtime_error::runtime_error(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_252 = 0;
    __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = error_counter + 1;
  std::__cxx11::wstring::c_str();
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)in_stack_fffffffffffff9c8,(string *)in_stack_fffffffffffff9c0,
             (method_type)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
  std::__cxx11::string::~string(local_278);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xed);
  poVar3 = std::operator<<(poVar3," from_utf<Char>(source.c_str(),encoding,stop)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if (0x14 < error_counter) {
    local_2a2 = 1;
    error_counter = error_counter + 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"Error limits reached, stopping unit test",&local_2a1);
    booster::runtime_error::runtime_error(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_2a2 = 0;
    __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  error_counter = error_counter + 1;
  pwVar5 = (wchar_t *)std::__cxx11::wstring::c_str();
  lVar6 = std::__cxx11::wstring::c_str();
  lVar7 = std::__cxx11::wstring::size();
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)local_2c8,pwVar5,(string *)(lVar6 + lVar7 * 4),in_EDX);
  std::__cxx11::string::~string(local_2c8);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xee);
  poVar3 = std::operator<<(poVar3,
                           " from_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding,stop)"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if (error_counter < 0x15) {
    test_counter = test_counter + 1;
    error_counter = error_counter + 1;
    booster::locale::conv::from_utf<wchar_t>
              (in_stack_fffffffffffff9d8,(locale *)in_stack_fffffffffffff9d0,
               (method_type)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
    std::__cxx11::string::~string(local_318);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xef);
    poVar3 = std::operator<<(poVar3," from_utf<Char>(source,l,stop)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    if (0x14 < error_counter) {
      local_342 = 1;
      error_counter = error_counter + 1;
      uVar4 = __cxa_allocate_exception(0x30);
      paVar10 = &local_341;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340,"Error limits reached, stopping unit test",paVar10);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      local_342 = 0;
      __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    test_counter = test_counter + 1;
    error_counter = error_counter + 1;
    std::__cxx11::wstring::c_str();
    booster::locale::conv::from_utf<wchar_t>
              ((wchar_t *)in_stack_fffffffffffff9c8,(locale *)in_stack_fffffffffffff9c0,
               (method_type)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
    std::__cxx11::string::~string(local_368);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar3,0xf0);
    this = std::operator<<(poVar8," from_utf<Char>(source.c_str(),l,stop)");
    mVar11 = (method_type)((ulong)poVar8 >> 0x20);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    if (error_counter < 0x15) {
      test_counter = test_counter + 1;
      error_counter = error_counter + 1;
      std::__cxx11::wstring::c_str();
      std::__cxx11::wstring::c_str();
      std::__cxx11::wstring::size();
      booster::locale::conv::from_utf<wchar_t>
                (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,(locale *)poVar3,mVar11);
      std::__cxx11::string::~string(local_3b8);
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xf1);
      this_00 = (runtime_error *)
                std::operator<<(poVar3,
                                " from_utf<Char>(source.c_str(),source.c_str()+source.size(),l,stop)"
                               );
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      if (error_counter < 0x15) {
        error_counter = error_counter + 1;
        std::locale::~locale(local_28);
        booster::locale::generator::~generator(local_20);
        return;
      }
      error_counter = error_counter + 1;
      uVar4 = __cxa_allocate_exception(0x30);
      s = (string *)local_3e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_3e1 + 1),"Error limits reached, stopping unit test",(allocator *)s
                );
      booster::runtime_error::runtime_error(this_00,s);
      __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    local_392 = 1;
    error_counter = error_counter + 1;
    uVar4 = __cxa_allocate_exception(0x30);
    paVar10 = &local_391;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"Error limits reached, stopping unit test",paVar10);
    booster::runtime_error::runtime_error(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    local_392 = 0;
    __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  local_2f2 = 1;
  error_counter = error_counter + 1;
  uVar4 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"Error limits reached, stopping unit test",&local_2f1);
  booster::runtime_error::runtime_error(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  local_2f2 = 0;
  __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void test_from_neg(std::basic_string<Char> source,std::string target,std::string encoding)
{
    using namespace booster::locale::conv;
    booster::locale::generator g;
    std::locale l=g("en_US."+encoding);

    TEST(from_utf<Char>(source,encoding)==target);
    TEST(from_utf<Char>(source.c_str(),encoding)==target);
    TEST(from_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target);
    TEST(from_utf<Char>(source,l)==target);
    TEST(from_utf<Char>(source.c_str(),l)==target);
    TEST(from_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target);

    TESTF(from_utf<Char>(source,encoding,stop));
    TESTF(from_utf<Char>(source.c_str(),encoding,stop));
    TESTF(from_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding,stop));
    TESTF(from_utf<Char>(source,l,stop));
    TESTF(from_utf<Char>(source.c_str(),l,stop));
    TESTF(from_utf<Char>(source.c_str(),source.c_str()+source.size(),l,stop));
}